

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Renderer_conflict FT_Lookup_Renderer(FT_Library library,FT_Glyph_Format format,FT_ListNode *node)

{
  FT_Renderer_conflict pFVar1;
  FT_ListNode pFVar2;
  
  if (library != (FT_Library)0x0) {
    pFVar2 = (library->renderers).head;
    if (node != (FT_ListNode *)0x0) {
      if (*node != (FT_ListNode)0x0) {
        pFVar2 = (*node)->next;
      }
      *node = (FT_ListNode)0x0;
    }
    for (; pFVar2 != (FT_ListNode)0x0; pFVar2 = pFVar2->next) {
      pFVar1 = (FT_Renderer_conflict)pFVar2->data;
      if (pFVar1->glyph_format == format) {
        if (node == (FT_ListNode *)0x0) {
          return pFVar1;
        }
        *node = pFVar2;
        return pFVar1;
      }
    }
  }
  return (FT_Renderer_conflict)0x0;
}

Assistant:

FT_BASE_DEF( FT_Renderer )
  FT_Lookup_Renderer( FT_Library       library,
                      FT_Glyph_Format  format,
                      FT_ListNode*     node )
  {
    FT_ListNode  cur;
    FT_Renderer  result = NULL;


    if ( !library )
      goto Exit;

    cur = library->renderers.head;

    if ( node )
    {
      if ( *node )
        cur = (*node)->next;
      *node = NULL;
    }

    while ( cur )
    {
      FT_Renderer  renderer = FT_RENDERER( cur->data );


      if ( renderer->glyph_format == format )
      {
        if ( node )
          *node = cur;

        result = renderer;
        break;
      }
      cur = cur->next;
    }

  Exit:
    return result;
  }